

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O2

void trsort64(saidx64_t *ISA,saidx64_t *SA,saidx64_t n,saidx64_t depth)

{
  saidx64_t *ISAd;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong *puVar4;
  saint_t sVar5;
  saint_t sVar6;
  saint_t sVar7;
  saidx64_t *ISAd_00;
  ulong *puVar8;
  long lVar9;
  ulong *puVar10;
  ulong *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong *puVar15;
  ulong *unaff_RBP;
  long lVar16;
  long lVar17;
  saidx64_t *psVar18;
  ulong uVar19;
  long lVar20;
  ulong *first;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *last;
  ulong *puVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong *local_cc8;
  ulong *local_cc0;
  saint_t local_cb4;
  ulong local_cb0;
  saidx64_t *local_ca8;
  long local_ca0;
  saidx64_t *local_c98;
  long local_c90;
  ulong *local_c88;
  ulong *local_c80;
  ulong local_c78;
  ulong *local_c70 [2];
  undefined8 local_c60;
  trbudget_t_conflict budget;
  anon_struct_32_5_90aca025_conflict stack [96];
  
  sVar5 = tr_ilg(n);
  budget.chance = (saidx64_t)((sVar5 * 2) / 3);
  local_ca8 = ISA + depth;
  psVar18 = SA + 1;
  puVar10 = (ulong *)(SA + n);
  puVar26 = (ulong *)-n;
  local_c90 = -(long)SA;
  local_c98 = psVar18;
  local_c88 = puVar10;
  local_c70[0] = puVar26;
  budget.remain = n;
  budget.incval = n;
LAB_0011265f:
  uVar19 = *SA;
  if ((long)uVar19 <= (long)local_c70[0]) {
    return;
  }
  lVar12 = (long)local_ca8 - (long)ISA >> 3;
  local_c60 = -lVar12;
  uVar23 = 0;
  local_ca0 = 0;
  puVar8 = (ulong *)SA;
LAB_001126a1:
  if ((long)uVar19 < 0) {
    puVar15 = puVar8 + -uVar19;
    uVar23 = uVar23 + uVar19;
  }
  else {
    if (uVar23 != 0) {
      puVar8[uVar23] = uVar23;
    }
    puVar15 = (ulong *)(psVar18 + ISA[uVar19]);
    uVar19 = (long)puVar15 - (long)puVar8;
    if (8 < (long)uVar19) {
      budget.count = 0;
      sVar5 = tr_ilg(uVar19 >> 3);
      uVar21 = 0xffffffff;
      psVar18 = local_ca8;
      local_c80 = puVar15;
      local_c70[1] = puVar8;
      uVar29 = 0;
LAB_00112702:
      uVar28 = uVar29;
      first = puVar8;
      last = puVar15;
      ISAd_00 = psVar18;
      uVar22 = (long)last - (long)first;
      uVar23 = (long)uVar22 >> 3;
      uVar19 = uVar23 - 1;
      local_c78 = uVar19 >> 1;
      puVar10 = last + -1;
      uVar24 = uVar23 >> 1;
      while( true ) {
        lVar20 = (long)(int)uVar28;
        psVar18 = ISAd_00;
        puVar15 = last;
        puVar8 = first;
        uVar29 = uVar28;
        if (sVar5 < 0) goto LAB_001128d3;
        if (8 < (long)uVar23) break;
        while (puVar15 = puVar8 + 1, puVar15 < last) {
          uVar30 = *puVar8;
          uVar27 = puVar8[1];
          while( true ) {
            lVar20 = ISAd_00[uVar27];
            lVar13 = ISAd_00[uVar30];
            puVar11 = puVar8;
            if (lVar13 <= lVar20) break;
            do {
              puVar8 = puVar11 + -1;
              puVar11[1] = uVar30;
              if (puVar8 < first) goto LAB_001127a6;
              uVar30 = *puVar8;
              puVar11 = puVar8;
            } while ((long)uVar30 < 0);
          }
LAB_001127a6:
          if (lVar20 == lVar13) {
            *puVar8 = ~*puVar8;
          }
          puVar8[1] = uVar27;
          puVar8 = puVar15;
        }
LAB_001128cb:
        sVar5 = -3;
      }
      local_cb0 = uVar23;
      if (sVar5 == 0) {
        uVar27 = uVar23;
        uVar30 = uVar24;
        if ((uVar22 & 8) == 0) {
          uVar1 = first[uVar23 - 1];
          uVar27 = uVar19;
          uVar30 = local_c78;
          if (ISAd_00[first[local_c78]] < ISAd_00[uVar1]) {
            first[uVar23 - 1] = first[local_c78];
            first[local_c78] = uVar1;
          }
        }
        while (0 < (long)uVar30) {
          uVar30 = uVar30 - 1;
          tr_fixdown(ISAd_00,(saidx64_t *)first,uVar30,uVar27);
        }
        if ((uVar22 & 8) == 0) {
          uVar23 = *first;
          *first = first[uVar27];
          first[uVar27] = uVar23;
          tr_fixdown(ISAd_00,(saidx64_t *)first,0,uVar27);
        }
        while (uVar23 = uVar27 - 1, puVar26 = puVar10, 1 < (long)uVar27) {
          uVar27 = *first;
          *first = first[uVar23];
          tr_fixdown(ISAd_00,(saidx64_t *)first,0,uVar23);
          first[uVar23] = uVar27;
          uVar27 = uVar23;
        }
        while (uVar23 = local_cb0, first < puVar26) {
          lVar20 = ISAd_00[*puVar26];
          unaff_RBP = puVar26;
          while ((unaff_RBP = unaff_RBP + -1, puVar26 = unaff_RBP, first <= unaff_RBP &&
                 (ISAd_00[*unaff_RBP] == lVar20))) {
            *unaff_RBP = ~*unaff_RBP;
          }
        }
        goto LAB_001128cb;
      }
      puVar26 = first + uVar24;
      local_cb4 = sVar5;
      if (uVar23 < 0x201) {
        puVar11 = first;
        local_cc0 = unaff_RBP;
        if (uVar23 < 0x21) goto LAB_001130ef;
        uVar23 = uVar23 * 2 & 0xfffffffffffffff8;
        puVar11 = (ulong *)((long)puVar10 - uVar23);
        uVar19 = *(ulong *)((long)first + uVar23);
        if (ISAd_00[*puVar26] < ISAd_00[*(ulong *)((long)first + uVar23)]) {
          uVar19 = *puVar26;
        }
        puVar25 = puVar26;
        puVar4 = (ulong *)((long)first + uVar23);
        if (ISAd_00[*puVar26] < ISAd_00[*(ulong *)((long)first + uVar23)]) {
          puVar25 = (ulong *)((long)first + uVar23);
          puVar4 = puVar26;
        }
        uVar23 = *puVar10;
        puVar26 = puVar11;
        if (ISAd_00[*puVar11] <= ISAd_00[uVar23]) {
          puVar26 = puVar10;
          uVar23 = *puVar11;
          puVar10 = puVar11;
        }
        puVar11 = puVar26;
        if (ISAd_00[uVar23] < ISAd_00[uVar19]) {
          puVar11 = puVar25;
          puVar25 = puVar26;
          puVar10 = puVar4;
        }
        puVar26 = puVar25;
        uVar19 = *first;
        local_cc8 = first;
        if (ISAd_00[*puVar25] < ISAd_00[*first]) {
          puVar26 = first;
          uVar19 = *puVar25;
          local_cc8 = puVar25;
        }
        if (ISAd_00[uVar19] <= ISAd_00[*puVar10]) {
          local_cc8 = puVar10;
          puVar11 = puVar26;
        }
        if (ISAd_00[*puVar11] <= ISAd_00[*local_cc8]) {
          local_cc8 = puVar11;
        }
      }
      else {
        uVar19 = uVar23 & 0xfffffffffffffff8;
        local_cc0 = unaff_RBP;
        puVar11 = (ulong *)tr_median3(ISAd_00,(saidx64_t *)first,(saidx64_t *)(uVar19 + (long)first)
                                      ,(saidx64_t *)(first + (uVar23 >> 3) * 2));
        puVar26 = (ulong *)tr_median3(ISAd_00,(saidx64_t *)((long)puVar26 - uVar19),
                                      (saidx64_t *)puVar26,(saidx64_t *)((long)puVar26 + uVar19));
        puVar10 = (ulong *)tr_median3(ISAd_00,(saidx64_t *)(puVar10 + (uVar23 >> 3) * -2),
                                      (saidx64_t *)((long)puVar10 - uVar19),(saidx64_t *)puVar10);
LAB_001130ef:
        local_cc8 = (ulong *)tr_median3(ISAd_00,(saidx64_t *)puVar11,(saidx64_t *)puVar26,
                                        (saidx64_t *)puVar10);
      }
      uVar19 = *first;
      *first = *local_cc8;
      *local_cc8 = uVar19;
      lVar13 = ISAd_00[*first];
      tr_partition(ISAd_00,(saidx64_t *)first,(saidx64_t *)(first + 1),(saidx64_t *)last,
                   (saidx64_t **)&local_cc8,(saidx64_t **)&local_cc0,lVar13);
      unaff_RBP = local_cc0;
      puVar26 = local_cc8;
      uVar19 = (long)local_cc0 - (long)local_cc8;
      uVar23 = (long)uVar19 >> 3;
      if (local_cb0 == uVar23) {
        sVar5 = trbudget_check(&budget,local_cb0);
        if (sVar5 != 0) {
          sVar5 = tr_ilg(local_cb0);
          psVar18 = ISAd_00 + lVar12;
          goto LAB_00112702;
        }
        if (-1 < (int)uVar21) {
          stack[uVar21].d = -1;
        }
        goto joined_r0x0011342c;
      }
      sVar6 = -1;
      local_cb0 = uVar19;
      if (ISA[*local_cc8] != lVar13) {
        sVar6 = tr_ilg(uVar23);
      }
      for (puVar10 = first; puVar10 < puVar26; puVar10 = puVar10 + 1) {
        ISA[*puVar10] = ((long)puVar26 - (long)SA >> 3) + -1;
      }
      if (unaff_RBP < last) {
        for (puVar10 = puVar26; puVar10 < unaff_RBP; puVar10 = puVar10 + 1) {
          ISA[*puVar10] = ((long)unaff_RBP - (long)SA >> 3) + -1;
        }
      }
      sVar5 = local_cb4 + -1;
      if ((1 < (long)uVar23) &&
         (local_cb4 = local_cb4 + -1, sVar7 = trbudget_check(&budget,uVar23), sVar5 = local_cb4,
         sVar7 != 0)) {
        lVar13 = (long)puVar26 - (long)first >> 3;
        lVar17 = (long)last - (long)unaff_RBP >> 3;
        sVar5 = sVar6;
        if (lVar17 < lVar13) {
          if (lVar13 <= (long)uVar23) {
            if (lVar17 < 2) {
              psVar18 = ISAd_00 + lVar12;
              puVar15 = unaff_RBP;
              puVar8 = puVar26;
              if (1 < lVar13) {
                stack[lVar20].a = ISAd_00 + lVar12;
                stack[lVar20].b = (saidx64_t *)puVar26;
                stack[lVar20].c = (saidx64_t *)unaff_RBP;
                stack[lVar20].d = sVar6;
                stack[lVar20].e = uVar21;
                psVar18 = ISAd_00;
                puVar15 = puVar26;
                puVar8 = first;
                sVar5 = local_cb4;
                uVar29 = uVar28 + 1;
              }
            }
            else {
              stack[lVar20].a = ISAd_00 + lVar12;
              stack[lVar20].b = (saidx64_t *)puVar26;
              stack[lVar20].c = (saidx64_t *)unaff_RBP;
              stack[lVar20].d = sVar6;
              stack[lVar20].e = uVar21;
              stack[lVar20 + 1].a = ISAd_00;
              stack[lVar20 + 1].b = (saidx64_t *)first;
              stack[lVar20 + 1].c = (saidx64_t *)puVar26;
              stack[lVar20 + 1].d = local_cb4;
              stack[lVar20 + 1].e = uVar21;
              puVar8 = unaff_RBP;
              sVar5 = local_cb4;
              uVar29 = uVar28 + 2;
            }
            goto LAB_00112702;
          }
          if (lVar17 <= (long)uVar23) {
            uVar29 = uVar28 + 1;
            stack[lVar20].a = ISAd_00;
            stack[lVar20].b = (saidx64_t *)first;
            stack[lVar20].c = (saidx64_t *)puVar26;
            stack[lVar20].d = local_cb4;
            stack[lVar20].e = uVar21;
            psVar18 = ISAd_00 + lVar12;
            puVar15 = unaff_RBP;
            puVar8 = puVar26;
            if (1 < lVar17) {
              stack[(int)uVar29].a = ISAd_00 + lVar12;
              stack[(int)uVar29].b = (saidx64_t *)puVar26;
              stack[(int)uVar29].c = (saidx64_t *)unaff_RBP;
              stack[(int)uVar29].d = sVar6;
              stack[(int)uVar29].e = uVar21;
              psVar18 = ISAd_00;
              puVar15 = last;
              puVar8 = unaff_RBP;
              sVar5 = local_cb4;
              uVar29 = uVar28 + 2;
            }
            goto LAB_00112702;
          }
          stack[lVar20].a = ISAd_00;
          stack[lVar20].b = (saidx64_t *)first;
          stack[lVar20].c = (saidx64_t *)puVar26;
          stack[lVar20].d = local_cb4;
          stack[lVar20].e = uVar21;
          stack[lVar20 + 1].a = ISAd_00;
          stack[lVar20 + 1].b = (saidx64_t *)unaff_RBP;
          stack[lVar20 + 1].c = (saidx64_t *)last;
        }
        else {
          if (lVar17 <= (long)uVar23) {
            if (lVar13 < 2) {
              psVar18 = ISAd_00 + lVar12;
              puVar15 = unaff_RBP;
              puVar8 = puVar26;
              if (1 < lVar17) {
                stack[lVar20].a = ISAd_00 + lVar12;
                stack[lVar20].b = (saidx64_t *)puVar26;
                stack[lVar20].c = (saidx64_t *)unaff_RBP;
                stack[lVar20].d = sVar6;
                stack[lVar20].e = uVar21;
                psVar18 = ISAd_00;
                puVar15 = last;
                puVar8 = unaff_RBP;
                sVar5 = local_cb4;
                uVar29 = uVar28 + 1;
              }
            }
            else {
              stack[lVar20].a = ISAd_00 + lVar12;
              stack[lVar20].b = (saidx64_t *)puVar26;
              stack[lVar20].c = (saidx64_t *)unaff_RBP;
              stack[lVar20].d = sVar6;
              stack[lVar20].e = uVar21;
              stack[lVar20 + 1].a = ISAd_00;
              stack[lVar20 + 1].b = (saidx64_t *)unaff_RBP;
              stack[lVar20 + 1].c = (saidx64_t *)last;
              stack[lVar20 + 1].d = local_cb4;
              stack[lVar20 + 1].e = uVar21;
              puVar15 = puVar26;
              sVar5 = local_cb4;
              uVar29 = uVar28 + 2;
            }
            goto LAB_00112702;
          }
          if (lVar13 <= (long)uVar23) {
            uVar29 = uVar28 + 1;
            stack[lVar20].a = ISAd_00;
            stack[lVar20].b = (saidx64_t *)unaff_RBP;
            stack[lVar20].c = (saidx64_t *)last;
            stack[lVar20].d = local_cb4;
            stack[lVar20].e = uVar21;
            psVar18 = ISAd_00 + lVar12;
            puVar15 = unaff_RBP;
            puVar8 = puVar26;
            if (1 < lVar13) {
              stack[(int)uVar29].a = ISAd_00 + lVar12;
              stack[(int)uVar29].b = (saidx64_t *)puVar26;
              stack[(int)uVar29].c = (saidx64_t *)unaff_RBP;
              stack[(int)uVar29].d = sVar6;
              stack[(int)uVar29].e = uVar21;
              psVar18 = ISAd_00;
              puVar15 = puVar26;
              puVar8 = first;
              sVar5 = local_cb4;
              uVar29 = uVar28 + 2;
            }
            goto LAB_00112702;
          }
          stack[lVar20].a = ISAd_00;
          stack[lVar20].b = (saidx64_t *)unaff_RBP;
          stack[lVar20].c = (saidx64_t *)last;
          stack[lVar20].d = local_cb4;
          stack[lVar20].e = uVar21;
          stack[lVar20 + 1].a = ISAd_00;
          stack[lVar20 + 1].b = (saidx64_t *)first;
          stack[lVar20 + 1].c = (saidx64_t *)puVar26;
        }
        stack[lVar20 + 1].d = local_cb4;
        stack[lVar20 + 1].e = uVar21;
        psVar18 = ISAd_00 + lVar12;
        puVar15 = unaff_RBP;
        puVar8 = puVar26;
        uVar29 = uVar28 + 2;
        goto LAB_00112702;
      }
      if ((8 < (long)local_cb0) && (-1 < (int)uVar21)) {
        stack[uVar21].d = -1;
      }
      lVar13 = (long)puVar26 - (long)first >> 3;
      lVar17 = (long)last - (long)unaff_RBP >> 3;
      if (lVar17 < lVar13) {
        puVar15 = puVar26;
        if (1 < lVar17) {
          stack[lVar20].a = ISAd_00;
          stack[lVar20].b = (saidx64_t *)first;
          stack[lVar20].c = (saidx64_t *)puVar26;
          stack[lVar20].d = sVar5;
          stack[lVar20].e = uVar21;
          puVar15 = last;
          puVar8 = unaff_RBP;
          uVar29 = uVar28 + 1;
          goto LAB_00112702;
        }
      }
      else {
        bVar3 = 1 < lVar13;
        puVar8 = unaff_RBP;
        lVar13 = lVar17;
        if (bVar3) {
          stack[lVar20].a = ISAd_00;
          stack[lVar20].b = (saidx64_t *)unaff_RBP;
          stack[lVar20].c = (saidx64_t *)last;
          stack[lVar20].d = sVar5;
          stack[lVar20].e = uVar21;
          puVar15 = puVar26;
          puVar8 = first;
          uVar29 = uVar28 + 1;
          goto LAB_00112702;
        }
      }
      if (lVar13 < 2) goto joined_r0x0011342c;
      goto LAB_00112702;
    }
    uVar23 = -(ulong)(uVar19 == 8);
  }
  goto LAB_001138b2;
LAB_001128d3:
  if (sVar5 == -2) {
    puVar26 = (ulong *)stack[lVar20 + -1].b;
    unaff_RBP = (ulong *)stack[lVar20 + -1].c;
    if (stack[lVar20 + -1].d == 0) {
      lVar17 = (long)ISAd_00 - (long)ISA >> 3;
      lVar13 = ((long)unaff_RBP - (long)SA >> 3) + -1;
      puVar10 = puVar26 + -1;
      for (; first <= puVar10; first = first + 1) {
        uVar19 = *first - lVar17;
        if ((-1 < (long)uVar19) && (ISA[uVar19] == lVar13)) {
          puVar10[1] = uVar19;
          puVar10 = puVar10 + 1;
          ISA[uVar19] = (long)puVar10 - (long)SA >> 3;
        }
      }
      puVar8 = unaff_RBP;
      while (last = last + -1, puVar10 + 1 < puVar8) {
        uVar19 = *last - lVar17;
        if ((-1 < (long)uVar19) && (ISA[uVar19] == lVar13)) {
          puVar8[-1] = uVar19;
          puVar8 = puVar8 + -1;
          ISA[uVar19] = (long)puVar8 - (long)SA >> 3;
        }
      }
    }
    else {
      if (-1 < (int)uVar21) {
        stack[uVar21].d = -1;
      }
      lVar14 = (long)ISAd_00 - (long)ISA >> 3;
      lVar9 = ((long)unaff_RBP - (long)SA >> 3) + -1;
      puVar10 = puVar26 + -1;
      lVar13 = -1;
      lVar17 = lVar13;
      for (; puVar8 <= puVar10; puVar8 = puVar8 + 1) {
        uVar19 = *puVar8;
        uVar23 = uVar19 - lVar14;
        lVar16 = lVar17;
        if ((-1 < (long)uVar23) && (ISA[uVar23] == lVar9)) {
          puVar10[1] = uVar23;
          puVar10 = puVar10 + 1;
          lVar16 = ISA[uVar19];
          if (lVar17 != lVar16) {
            lVar13 = (long)puVar10 - (long)SA >> 3;
          }
          ISA[uVar23] = lVar13;
        }
        lVar17 = lVar16;
      }
      lVar16 = local_c90 + (long)puVar10;
      lVar17 = -1;
      for (puVar8 = puVar10; first <= puVar8; puVar8 = puVar8 + -1) {
        lVar2 = ISA[*puVar8];
        if (lVar17 != lVar2) {
          lVar13 = lVar16 >> 3;
        }
        if (lVar13 != lVar2) {
          ISA[*puVar8] = lVar13;
        }
        lVar16 = lVar16 + -8;
        lVar17 = lVar2;
      }
      puVar8 = unaff_RBP;
      lVar17 = -1;
      while (last = last + -1, puVar10 + 1 < puVar8) {
        uVar19 = *last;
        uVar23 = uVar19 - lVar14;
        if ((-1 < (long)uVar23) && (ISA[uVar23] == lVar9)) {
          puVar8[-1] = uVar23;
          puVar8 = puVar8 + -1;
          lVar16 = ISA[uVar19];
          if (lVar17 != lVar16) {
            lVar13 = (long)puVar8 - (long)SA >> 3;
          }
          ISA[uVar23] = lVar13;
          lVar17 = lVar16;
        }
      }
    }
    local_cc8 = puVar26;
    local_cc0 = unaff_RBP;
    if (uVar28 == 1) goto LAB_00113843;
    uVar21 = *(uint *)((long)&local_c60 + lVar20 * 0x20 + 4);
    psVar18 = (saidx64_t *)(&local_c78)[lVar20 * 4];
    puVar15 = local_c70[lVar20 * 4 + 1];
    puVar8 = local_c70[lVar20 * 4];
    sVar5 = *(saint_t *)(&local_c60 + lVar20 * 4);
    uVar29 = uVar28 - 2;
    goto LAB_00112702;
  }
  local_cc8 = puVar26;
  if (sVar5 == -1) {
    ISAd = ISAd_00 + local_c60;
    local_cc0 = unaff_RBP;
    tr_partition(ISAd,(saidx64_t *)first,(saidx64_t *)first,(saidx64_t *)last,
                 (saidx64_t **)&local_cc8,(saidx64_t **)&local_cc0,((long)last - (long)SA >> 3) + -1
                );
    unaff_RBP = local_cc0;
    puVar26 = local_cc8;
    if (local_cc8 < last) {
      for (puVar10 = first; puVar10 < local_cc8; puVar10 = puVar10 + 1) {
        ISA[*puVar10] = ((long)local_cc8 - (long)SA >> 3) + -1;
      }
    }
    if (local_cc0 < last) {
      for (puVar10 = local_cc8; puVar10 < local_cc0; puVar10 = puVar10 + 1) {
        ISA[*puVar10] = ((long)local_cc0 - (long)SA >> 3) + -1;
      }
    }
    if (8 < (long)local_cc0 - (long)local_cc8) {
      stack[lVar20].a = (saidx64_t *)0x0;
      stack[lVar20].b = (saidx64_t *)local_cc8;
      stack[lVar20].c = (saidx64_t *)local_cc0;
      stack[lVar20].d = 0;
      stack[lVar20].e = 0;
      stack[lVar20 + 1].a = ISAd;
      stack[lVar20 + 1].b = (saidx64_t *)first;
      stack[lVar20 + 1].c = (saidx64_t *)last;
      stack[lVar20 + 1].d = -2;
      stack[lVar20 + 1].e = uVar21;
      uVar29 = uVar28 + 2;
      uVar21 = uVar28;
    }
    lVar20 = (long)local_cc8 - (long)first >> 3;
    lVar13 = (long)last - (long)local_cc0 >> 3;
    if (lVar13 < lVar20) {
      if (1 < lVar13) {
        stack[(int)uVar29].a = ISAd_00;
        stack[(int)uVar29].b = (saidx64_t *)first;
        stack[(int)uVar29].c = (saidx64_t *)local_cc8;
        sVar5 = tr_ilg(lVar20);
        stack[(int)uVar29].d = sVar5;
        stack[(int)uVar29].e = uVar21;
        sVar5 = tr_ilg(lVar13);
        puVar8 = unaff_RBP;
        uVar29 = uVar29 + 1;
        goto LAB_00112702;
      }
      if (1 < lVar20) {
        sVar5 = tr_ilg(lVar20);
        puVar15 = puVar26;
        goto LAB_00112702;
      }
    }
    else {
      if (1 < lVar20) {
        stack[(int)uVar29].a = ISAd_00;
        stack[(int)uVar29].b = (saidx64_t *)local_cc0;
        stack[(int)uVar29].c = (saidx64_t *)last;
        sVar5 = tr_ilg(lVar13);
        stack[(int)uVar29].d = sVar5;
        stack[(int)uVar29].e = uVar21;
        sVar5 = tr_ilg(lVar20);
        puVar15 = puVar26;
        uVar29 = uVar29 + 1;
        goto LAB_00112702;
      }
      if (1 < lVar13) {
        sVar5 = tr_ilg(lVar13);
        puVar8 = unaff_RBP;
        goto LAB_00112702;
      }
    }
    if (uVar29 == 0) goto LAB_00113843;
    uVar21 = stack[(long)(int)uVar29 + -1].e;
    psVar18 = stack[(long)(int)uVar29 + -1].a;
    puVar15 = (ulong *)stack[(long)(int)uVar29 + -1].c;
    puVar8 = (ulong *)stack[(long)(int)uVar29 + -1].b;
    sVar5 = stack[(long)(int)uVar29 + -1].d;
    uVar29 = uVar29 - 1;
    goto LAB_00112702;
  }
  uVar19 = *first;
  if (-1 < (long)uVar19) {
    lVar13 = local_c90 + (long)first;
    do {
      first = first + 1;
      ISA[uVar19] = lVar13 >> 3;
      local_cc8 = first;
      if (last <= first) break;
      uVar19 = *first;
      lVar13 = lVar13 + 8;
    } while (-1 < (long)uVar19);
  }
  puVar26 = local_cc8;
  local_cc0 = unaff_RBP;
  if (first < last) {
    uVar19 = *first;
    lVar13 = 8;
    do {
      lVar17 = lVar13;
      *(ulong *)((long)first + lVar17 + -8) = ~uVar19;
      uVar19 = *(ulong *)((long)first + lVar17);
      lVar13 = lVar17 + 8;
    } while ((long)uVar19 < 0);
    sVar5 = -1;
    if (ISA[uVar19] != ISAd_00[uVar19]) {
      sVar5 = tr_ilg((lVar17 >> 3) + 1);
    }
    puVar26 = (ulong *)((long)first + lVar13);
    if (puVar26 < last) {
      for (unaff_RBP = first; local_cc0 = unaff_RBP, unaff_RBP < puVar26; unaff_RBP = unaff_RBP + 1)
      {
        ISA[*unaff_RBP] = ((long)first + lVar13 + local_c90 >> 3) + -1;
      }
    }
    local_cc8 = puVar26;
    sVar6 = trbudget_check(&budget,lVar13 >> 3);
    if (sVar6 != 0) {
      lVar17 = (long)last + (-lVar13 - (long)first);
      puVar15 = puVar26;
      puVar8 = first;
      if (lVar17 < lVar13) {
        psVar18 = ISAd_00 + lVar12;
        if (8 < lVar17) {
          stack[lVar20].a = ISAd_00 + lVar12;
          stack[lVar20].b = (saidx64_t *)first;
          stack[lVar20].c = (saidx64_t *)puVar26;
          stack[lVar20].d = sVar5;
          stack[lVar20].e = uVar21;
          psVar18 = ISAd_00;
          puVar15 = last;
          puVar8 = puVar26;
          sVar5 = -3;
          uVar29 = uVar28 + 1;
        }
      }
      else {
        stack[lVar20].a = ISAd_00;
        stack[lVar20].b = (saidx64_t *)puVar26;
        stack[lVar20].c = (saidx64_t *)last;
        stack[lVar20].d = -3;
        stack[lVar20].e = uVar21;
        psVar18 = ISAd_00 + lVar12;
        uVar29 = uVar28 + 1;
      }
      goto LAB_00112702;
    }
    if (-1 < (int)uVar21) {
      stack[uVar21].d = -1;
    }
    puVar8 = puVar26;
    sVar5 = -3;
    if (8 < (long)last + (-lVar13 - (long)first)) goto LAB_00112702;
  }
joined_r0x0011342c:
  if (uVar28 != 0) {
    uVar21 = stack[lVar20 + -1].e;
    psVar18 = stack[lVar20 + -1].a;
    puVar15 = (ulong *)stack[lVar20 + -1].c;
    puVar8 = (ulong *)stack[lVar20 + -1].b;
    sVar5 = stack[lVar20 + -1].d;
    uVar29 = uVar28 - 1;
    goto LAB_00112702;
  }
LAB_00113843:
  puVar15 = local_c80;
  psVar18 = local_c98;
  puVar10 = local_c88;
  if (budget.count == 0) {
    uVar23 = (long)local_c70[1] - (long)local_c80 >> 3;
LAB_001138b2:
    if (puVar10 <= puVar15) goto LAB_001138c2;
  }
  else {
    local_ca0 = local_ca0 + budget.count;
    if (local_c88 <= local_c80) goto LAB_001138d0;
    uVar23 = 0;
  }
  uVar19 = *puVar15;
  puVar8 = puVar15;
  goto LAB_001126a1;
LAB_001138c2:
  if (uVar23 != 0) {
    puVar15[uVar23] = uVar23;
  }
LAB_001138d0:
  if (local_ca0 == 0) {
    return;
  }
  local_ca8 = local_ca8 + lVar12;
  goto LAB_0011265f;
}

Assistant:

void
trsort(saidx_t *ISA, saidx_t *SA, saidx_t n, saidx_t depth) {
  saidx_t *ISAd;
  saidx_t *first, *last;
  trbudget_t budget;
  saidx_t t, skip, unsorted;

  trbudget_init(&budget, tr_ilg(n) * 2 / 3, n);
/*  trbudget_init(&budget, tr_ilg(n) * 3 / 4, n); */
  for(ISAd = ISA + depth; -n < *SA; ISAd += ISAd - ISA) {
    first = SA;
    skip = 0;
    unsorted = 0;
    do {
      if((t = *first) < 0) { first -= t; skip += t; }
      else {
        if(skip != 0) { *(first + skip) = skip; skip = 0; }
        last = SA + ISA[t] + 1;
        if(1 < (last - first)) {
          budget.count = 0;
          tr_introsort(ISA, ISAd, SA, first, last, &budget);
          if(budget.count != 0) { unsorted += budget.count; }
          else { skip = first - last; }
        } else if((last - first) == 1) {
          skip = -1;
        }
        first = last;
      }
    } while(first < (SA + n));
    if(skip != 0) { *(first + skip) = skip; }
    if(unsorted == 0) { break; }
  }
}